

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

Token __thiscall
slang::parsing::NumberParser::finishValue(NumberParser *this,Token firstToken,bool singleToken)

{
  LiteralBase LVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  logic_error *this_00;
  size_type sVar6;
  reference plVar7;
  Diagnostic *this_01;
  uint *puVar8;
  size_type in_R9;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  LiteralBase local_1f4;
  span<const_slang::logic_t,_18446744073709551615UL> local_1b8;
  SVInt local_1a8;
  SourceLocation local_198;
  undefined4 local_190;
  uint local_18c;
  SourceLocation local_188;
  undefined4 local_17c;
  uint local_178;
  undefined1 local_171;
  bitwidth_t bits;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a8;
  logic_t local_a1;
  uint32_t multiplier;
  SourceLocation local_90;
  undefined4 local_88;
  SVInt local_78;
  undefined1 local_68 [8];
  SVInt result;
  bitwidth_t width;
  anon_class_24_3_421b894d createResult;
  bool singleToken_local;
  NumberParser *this_local;
  Token firstToken_local;
  
  firstToken_local._0_8_ = firstToken.info;
  this_local = firstToken._0_8_;
  createResult.this = (NumberParser *)&this_local;
  createResult.firstToken = (Token *)((long)&createResult.singleToken + 7);
  _width = this;
  createResult.singleToken._7_1_ = singleToken;
  if ((this->valid & 1U) == 0) {
    result.super_SVIntStorage.signFlag = false;
    result.super_SVIntStorage.unknownFlag = false;
    result.super_SVIntStorage._14_2_ = 0;
    join_0x00000010_0x00000000_ =
         finishValue(slang::parsing::Token,bool)::$_0::operator()
                   ((__0 *)&width,(int *)&result.super_SVIntStorage.signFlag);
  }
  else if ((this->literalBase == Decimal) && ((this->hasUnknown & 1U) == 0)) {
    result.super_SVIntStorage.bitWidth = SVInt::getBitWidth(&this->decimalValue);
    SVInt::SVInt((SVInt *)local_68);
    if (this->sizeBits == 0) {
      if (result.super_SVIntStorage.bitWidth < 0x20) {
        SVInt::resize(&local_78,(int)this + 0x18);
        SVInt::operator=((SVInt *)local_68,&local_78);
        SVInt::~SVInt(&local_78);
      }
      else {
        SVInt::operator=((SVInt *)local_68,&this->decimalValue);
      }
    }
    else if (result.super_SVIntStorage.bitWidth == this->sizeBits) {
      SVInt::operator=((SVInt *)local_68,&this->decimalValue);
    }
    else {
      if (this->sizeBits < result.super_SVIntStorage.bitWidth) {
        local_88 = 0xb0003;
        local_90 = this->firstLocation;
        addDiag(this,(DiagCode)0xb0003,local_90);
      }
      SVInt::resize((SVInt *)&multiplier,(int)this + 0x18);
      SVInt::operator=((SVInt *)local_68,(SVInt *)&multiplier);
      SVInt::~SVInt((SVInt *)&multiplier);
    }
    SVInt::setSigned((SVInt *)local_68,(bool)(this->signFlag & 1));
    join_0x00000010_0x00000000_ =
         finishValue(slang::parsing::Token,bool)::$_0::operator()((__0 *)&width,(SVInt *)local_68);
    SVInt::~SVInt((SVInt *)local_68);
  }
  else {
    bVar4 = SmallVectorBase<slang::logic_t>::empty
                      (&(this->digits).super_SmallVectorBase<slang::logic_t>);
    if (bVar4) {
      logic_t::logic_t(&local_a1,'\0');
      SmallVectorBase<slang::logic_t>::push_back
                (&(this->digits).super_SmallVectorBase<slang::logic_t>,&local_a1);
    }
    else if (this->literalBase != Decimal) {
      local_a8 = 0;
      LVar1 = this->literalBase;
      if (LVar1 == Binary) {
        local_a8 = 1;
      }
      else if (LVar1 == Octal) {
        local_a8 = 3;
      }
      else {
        if (LVar1 != Hex) {
          local_171 = 1;
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/NumberParser.cpp"
                     ,&local_149);
          std::operator+(&local_128,&local_148,":");
          std::__cxx11::to_string((string *)&bits,0xe5);
          std::operator+(&local_108,&local_128,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bits)
          ;
          std::operator+(&local_e8,&local_108,": ");
          std::operator+(&local_c8,&local_e8,"Default case should be unreachable!");
          std::logic_error::logic_error(this_00,(string *)&local_c8);
          local_171 = 0;
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        local_a8 = 4;
      }
      local_178 = 0;
      sVar6 = SmallVectorBase<slang::logic_t>::size
                        (&(this->digits).super_SmallVectorBase<slang::logic_t>);
      if (1 < sVar6) {
        sVar6 = SmallVectorBase<slang::logic_t>::size
                          (&(this->digits).super_SmallVectorBase<slang::logic_t>);
        local_178 = ((int)sVar6 + -1) * local_a8;
      }
      plVar7 = SmallVectorBase<slang::logic_t>::operator[]
                         (&(this->digits).super_SmallVectorBase<slang::logic_t>,0);
      bVar4 = logic_t::isUnknown(plVar7);
      if (!bVar4) {
        plVar7 = SmallVectorBase<slang::logic_t>::operator[]
                           (&(this->digits).super_SmallVectorBase<slang::logic_t>,0);
        uVar5 = clog2((long)(int)(plVar7->value + 1));
        local_178 = uVar5 + local_178;
      }
      if (this->sizeBits < local_178) {
        if (this->sizeBits == 0) {
          if (0xffffff < local_178) {
            local_178 = 0xffffff;
            local_17c = 0x20003;
            local_188 = this->firstLocation;
            this_01 = addDiag(this,(DiagCode)0x20003,local_188);
            Diagnostic::operator<<(this_01,0xffffff);
          }
          local_18c = 0x20;
          puVar8 = std::max<unsigned_int>(&local_18c,&local_178);
          this->sizeBits = *puVar8;
        }
        else {
          local_190 = 0xb0003;
          local_198 = this->firstLocation;
          addDiag(this,(DiagCode)0xb0003,local_198);
        }
      }
    }
    if (this->sizeBits == 0) {
      local_1f4 = 0x20;
    }
    else {
      local_1f4 = (LiteralBase)this->sizeBits;
    }
    bVar4 = (bool)this->literalBase;
    bVar2 = this->hasUnknown;
    bVar3 = this->signFlag;
    nonstd::span_lite::span<const_slang::logic_t,_18446744073709551615UL>::
    span<slang::SmallVector<slang::logic_t,_40UL>,_0>(&local_1b8,&this->digits);
    digits.data_ = (pointer)(ulong)(bVar2 & 1);
    digits.size_ = in_R9;
    SVInt::fromDigits((bitwidth_t)&local_1a8,local_1f4,bVar4,(bool)(bVar3 & 1),digits);
    join_0x00000010_0x00000000_ =
         finishValue(slang::parsing::Token,bool)::$_0::operator()((__0 *)&width,&local_1a8);
    SVInt::~SVInt(&local_1a8);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal) {
        // If we added an x or z, fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        if (!hasUnknown) {
            // If no size was specified, just return the value as-is. Otherwise,
            // resize it to match the desired size. Warn if that will truncate.
            bitwidth_t width = decimalValue.getBitWidth();
            SVInt result;
            if (!sizeBits) {
                // Unsized numbers are required to be at least 32 bits by the spec.
                if (width < 32)
                    result = decimalValue.resize(32);
                else
                    result = std::move(decimalValue);
            }
            else if (width != sizeBits) {
                if (width > sizeBits)
                    addDiag(diag::VectorLiteralOverflow, firstLocation);

                result = decimalValue.resize(sizeBits);
            }
            else {
                result = std::move(decimalValue);
            }

            result.setSigned(signFlag);
            return createResult(result);
        }
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                ASSUME_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += clog2(digits[0].value + 1);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                // We should warn about overflow here, but the spec says it is valid and
                // the literal gets truncated. Definitely a warning though.
                addDiag(diag::VectorLiteralOverflow, firstLocation);
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}